

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  StringEntry *__tmp;
  StringEntry *pSVar4;
  StringEntry *pSVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  StringEntry **ppSVar11;
  bool bVar12;
  long lVar13;
  bool bVar14;
  uint local_2cc;
  StringEntry *se [2];
  DynamicEntryList dentries;
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  _Vector_base<char,_std::allocator<char>_> local_248;
  ofstream f;
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  zeroPosition[0] = 0;
  zeroPosition[1] = 0;
  zeroSize[0] = 0;
  zeroSize[1] = 0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmELF::cmELF((cmELF *)&f,(file->_M_dataplus)._M_p);
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  pSVar4 = cmELF::GetRPath((cmELF *)&f);
  if (pSVar4 == (StringEntry *)0x0) {
    ppSVar11 = se;
  }
  else {
    ppSVar11 = se + 1;
    se[0] = pSVar4;
  }
  pSVar5 = cmELF::GetRunPath((cmELF *)&f);
  local_2cc = 1;
  if (pSVar5 == (StringEntry *)0x0) {
    uVar3 = local_2cc;
    if (pSVar4 == (StringEntry *)0x0) {
      bVar12 = true;
      bVar14 = false;
      uVar6 = 0;
      uVar10 = 0;
      goto LAB_00155676;
    }
  }
  else {
    *ppSVar11 = pSVar5;
    pSVar5 = se[0];
    uVar3 = 1;
    if (pSVar4 != (StringEntry *)0x0) {
      local_2cc = 2;
      uVar3 = 2;
      if (se[1]->IndexInSection < se[0]->IndexInSection) {
        se[0] = se[1];
        se[1] = pSVar5;
        uVar3 = local_2cc;
      }
    }
  }
  local_2cc = uVar3;
  cmELF::GetDynamicEntries(&dentries,(cmELF *)&f);
  bVar14 = dentries.
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           dentries.
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar14) {
    for (uVar10 = 0; local_2cc != uVar10; uVar10 = uVar10 + 1) {
      zeroPosition[uVar10] = se[uVar10]->Position;
      zeroSize[uVar10] = se[uVar10]->Size;
    }
    uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)&f,1);
    uVar7 = cmELF::GetDynamicEntryPosition((cmELF *)&f,0);
    lVar13 = 0;
    do {
      while( true ) {
        if (dentries.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            dentries.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          cmELF::EncodeDynamicEntries
                    ((vector<char,_std::allocator<char>_> *)&local_248,(cmELF *)&f,&dentries);
          std::vector<char,_std::allocator<char>_>::_M_move_assign(&bytes);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_248);
          uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)&f,0);
          goto LAB_00155667;
        }
        lVar1 = (dentries.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
        if ((lVar1 == 0xf) || (lVar1 == 0x1d)) break;
        if (lVar1 == 0x70000035) {
          (dentries.
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second =
               (dentries.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second + lVar13 * (uVar6 - uVar7);
        }
        dentries.
        super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             dentries.
             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      dentries.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)std::
                    vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ::erase(&dentries,
                            (const_iterator)
                            dentries.
                            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      lVar13 = lVar13 + 1;
    } while( true );
  }
  if (emsg != (string *)0x0) {
    std::__cxx11::string::assign((char *)emsg);
  }
  uVar6 = 0;
  local_2cc = 0;
LAB_00155667:
  std::
  _Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  ~_Vector_base(&dentries.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               );
  uVar10 = (ulong)local_2cc;
  bVar12 = false;
LAB_00155676:
  cmELF::~cmELF((cmELF *)&f);
  if (bVar14) {
    std::ofstream::ofstream(&f,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    if (((((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
          == 0) &&
        (plVar8 = (long *)std::ostream::seekp(&f,uVar6,0),
        (*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0)) &&
       (plVar8 = (long *)std::ostream::write((char *)&f,
                                             (long)bytes.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
       (*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0)) {
      uVar2 = 0;
      do {
        uVar9 = uVar2;
        if (uVar9 == uVar10) {
          bVar14 = false;
          goto LAB_00155823;
        }
        plVar8 = (long *)std::ostream::seekp(&f,zeroPosition[uVar9],0);
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::assign((char *)emsg);
          }
          goto LAB_00155745;
        }
        uVar6 = zeroSize[uVar9];
        while (bVar14 = uVar6 != 0, uVar6 = uVar6 - 1, bVar14) {
          std::operator<<(&f.super_basic_ostream<char,_std::char_traits<char>_>,'\0');
        }
        uVar2 = uVar9 + 1;
      } while (((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
                [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]]
               & 5) == 0);
      bVar14 = uVar9 < uVar10;
      if (emsg == (string *)0x0) {
        bVar12 = false;
      }
      else {
        std::__cxx11::string::assign((char *)emsg);
        bVar12 = false;
      }
LAB_00155823:
      bVar12 = (bool)(bVar14 ^ 1U | bVar12);
      if ((removed != (bool *)0x0) && (bVar14 == false)) {
        *removed = true;
        bVar12 = true;
      }
    }
    else {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
      }
LAB_00155745:
      bVar12 = false;
    }
    std::ofstream::~ofstream(&f);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&bytes.super__Vector_base<char,_std::allocator<char>_>);
  return bVar12;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
  if (removed) {
    *removed = false;
  }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = { 0, 0 };
  unsigned long zeroSize[2] = { 0, 0 };
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it and sort them by index
    // in the dynamic section header.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count++] = se_rpath;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count++] = se_runpath;
    }
    if (se_count == 0) {
      // There is no RPATH or RUNPATH anyway.
      return true;
    }
    if (se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection) {
      std::swap(se[0], se[1]);
    }

    // Obtain a copy of the dynamic entries
    cmELF::DynamicEntryList dentries = elf.GetDynamicEntries();
    if (dentries.empty()) {
      // This should happen only for invalid ELF files where a DT_NULL
      // appears before the end of the table.
      if (emsg) {
        *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
      return false;
    }

    // Save information about the string entries to be zeroed.
    zeroCount = se_count;
    for (int i = 0; i < se_count; ++i) {
      zeroPosition[i] = se[i]->Position;
      zeroSize[i] = se[i]->Size;
    }

    // Get size of one DYNAMIC entry
    unsigned long const sizeof_dentry =
      elf.GetDynamicEntryPosition(1) - elf.GetDynamicEntryPosition(0);

    // Adjust the entry list as necessary to remove the run path
    unsigned long entriesErased = 0;
    for (cmELF::DynamicEntryList::iterator it = dentries.begin();
         it != dentries.end();) {
      if (it->first == cmELF::TagRPath || it->first == cmELF::TagRunPath) {
        it = dentries.erase(it);
        entriesErased++;
        continue;
      }
      if (cmELF::TagMipsRldMapRel != 0 &&
          it->first == cmELF::TagMipsRldMapRel) {
        // Background: debuggers need to know the "linker map" which contains
        // the addresses each dynamic object is loaded at. Most arches use
        // the DT_DEBUG tag which the dynamic linker writes to (directly) and
        // contain the location of the linker map, however on MIPS the
        // .dynamic section is always read-only so this is not possible. MIPS
        // objects instead contain a DT_MIPS_RLD_MAP tag which contains the
        // address where the dynamic linker will write to (an indirect
        // version of DT_DEBUG). Since this doesn't work when using PIE, a
        // relative equivalent was created - DT_MIPS_RLD_MAP_REL. Since this
        // version contains a relative offset, moving it changes the
        // calculated address. This may cause the dynamic linker to write
        // into memory it should not be changing.
        //
        // To fix this, we adjust the value of DT_MIPS_RLD_MAP_REL here. If
        // we move it up by n bytes, we add n bytes to the value of this tag.
        it->second += entriesErased * sizeof_dentry;
      }

      it++;
    }

    // Encode new entries list
    bytes = elf.EncodeDynamicEntries(dentries);
    bytesBegin = elf.GetDynamicEntryPosition(0);
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                    std::ios::in | std::ios::out | std::ios::binary);
  if (!f) {
    if (emsg) {
      *emsg = "Error opening file for update.";
    }
    return false;
  }

  // Write the new DYNAMIC table header.
  if (!f.seekp(bytesBegin)) {
    if (emsg) {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
    }
    return false;
  }
  if (!f.write(&bytes[0], bytes.size())) {
    if (emsg) {
      *emsg = "Error replacing DYNAMIC table header.";
    }
    return false;
  }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for (int i = 0; i < zeroCount; ++i) {
    if (!f.seekp(zeroPosition[i])) {
      if (emsg) {
        *emsg = "Error seeking to RPATH position.";
      }
      return false;
    }
    for (unsigned long j = 0; j < zeroSize[i]; ++j) {
      f << '\0';
    }
    if (!f) {
      if (emsg) {
        *emsg = "Error writing the empty rpath string to the file.";
      }
      return false;
    }
  }

  // Everything was updated successfully.
  if (removed) {
    *removed = true;
  }
  return true;
}